

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::Tables::AddSymbol(Tables *this,string *full_name,Symbol symbol)

{
  bool bVar1;
  LogMessage *other;
  pair<std::__detail::_Node_iterator<google::protobuf::Symbol,_true,_true>,_bool> pVar2;
  value_type local_c0;
  _Node_iterator_base<google::protobuf::Symbol,_true> local_b8;
  undefined1 local_b0;
  _Node_iterator_base<google::protobuf::Symbol,_true> local_a8;
  undefined1 local_a0;
  LogFinisher local_95 [20];
  byte local_81;
  LogMessage local_80;
  StringPiece local_48;
  StringPiece local_38;
  string *local_28;
  string *full_name_local;
  Tables *this_local;
  Symbol symbol_local;
  
  local_28 = full_name;
  full_name_local = (string *)this;
  this_local = (Tables *)symbol.ptr_;
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_38,full_name);
  local_48 = Symbol::full_name((Symbol *)&this_local);
  bVar1 = stringpiece_internal::operator==(local_38,local_48);
  local_81 = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x679);
    local_81 = 1;
    other = internal::LogMessage::operator<<
                      (&local_80,"CHECK failed: (full_name) == (symbol.full_name()): ");
    internal::LogFinisher::operator=(local_95,other);
  }
  if ((local_81 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_80);
  }
  pVar2 = std::
          unordered_set<google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
          ::insert(&this->symbols_by_name_,(value_type *)&this_local);
  local_b8._M_cur =
       (__node_type *)pVar2.first.super__Node_iterator_base<google::protobuf::Symbol,_true>._M_cur;
  local_b0 = pVar2.second;
  bVar1 = ((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  if (bVar1) {
    local_a8._M_cur = local_b8._M_cur;
    local_a0 = local_b0;
    local_c0 = (value_type)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&this->symbols_after_checkpoint_,&local_c0);
  }
  return bVar1;
}

Assistant:

bool DescriptorPool::Tables::AddSymbol(const std::string& full_name,
                                       Symbol symbol) {
  GOOGLE_DCHECK_EQ(full_name, symbol.full_name());
  if (symbols_by_name_.insert(symbol).second) {
    symbols_after_checkpoint_.push_back(full_name.c_str());
    return true;
  } else {
    return false;
  }
}